

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O3

void __thiscall Table::Table(Table *this,Table *other)

{
  pointer ppCVar1;
  pointer ppVar2;
  
  this->_vptr_Table = (_func_int **)&PTR__Table_00110870;
  this->capacity = other->capacity;
  this->open = other->open;
  ppCVar1 = (other->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  (this->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (other->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppCVar1;
  (this->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (other->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (other->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (other->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (other->customersList).super__Vector_base<Customer_*,_std::allocator<Customer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar2 = (other->orderList).
           super__Vector_base<std::pair<int,_Dish>,_std::allocator<std::pair<int,_Dish>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->orderList).super__Vector_base<std::pair<int,_Dish>,_std::allocator<std::pair<int,_Dish>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (other->orderList).
       super__Vector_base<std::pair<int,_Dish>,_std::allocator<std::pair<int,_Dish>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->orderList).super__Vector_base<std::pair<int,_Dish>,_std::allocator<std::pair<int,_Dish>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  (this->orderList).super__Vector_base<std::pair<int,_Dish>,_std::allocator<std::pair<int,_Dish>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->orderList).
       super__Vector_base<std::pair<int,_Dish>,_std::allocator<std::pair<int,_Dish>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (other->orderList).
  super__Vector_base<std::pair<int,_Dish>,_std::allocator<std::pair<int,_Dish>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (other->orderList).
  super__Vector_base<std::pair<int,_Dish>,_std::allocator<std::pair<int,_Dish>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (other->orderList).
  super__Vector_base<std::pair<int,_Dish>,_std::allocator<std::pair<int,_Dish>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Table::Table(Table &&other) : capacity(other.capacity), open(other.open), customersList(std::move(other.customersList)), orderList(std::move(other.orderList))
{
}